

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O3

void __thiscall
OptionRecordDouble::OptionRecordDouble
          (OptionRecordDouble *this,string *Xname,string *Xdescription,bool Xadvanced,
          double *Xvalue_pointer,double Xlower_bound,double Xdefault_value,double Xupper_bound)

{
  pointer pcVar1;
  string local_70;
  string local_50;
  
  pcVar1 = (Xname->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + Xname->_M_string_length);
  pcVar1 = (Xdescription->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + Xdescription->_M_string_length);
  OptionRecord::OptionRecord(&this->super_OptionRecord,kDouble,&local_50,&local_70,Xadvanced);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_OptionRecord)._vptr_OptionRecord = (_func_int **)&PTR__OptionRecord_00159608;
  this->value = Xvalue_pointer;
  this->lower_bound = Xlower_bound;
  this->default_value = Xdefault_value;
  this->upper_bound = Xupper_bound;
  *Xvalue_pointer = Xdefault_value;
  return;
}

Assistant:

OptionRecordDouble(std::string Xname, std::string Xdescription,
                     bool Xadvanced, double* Xvalue_pointer,
                     double Xlower_bound, double Xdefault_value,
                     double Xupper_bound)
      : OptionRecord(HighsOptionType::kDouble, Xname, Xdescription, Xadvanced) {
    value = Xvalue_pointer;
    lower_bound = Xlower_bound;
    default_value = Xdefault_value;
    upper_bound = Xupper_bound;
    *value = default_value;
  }